

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O0

void __thiscall Lz77Decoder::run(Lz77Decoder *this)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  string local_678;
  string local_658;
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [36];
  undefined4 local_5d4;
  undefined1 local_5d0 [4];
  int len;
  int local_5ac;
  undefined1 local_5a8 [4];
  int amount;
  int local_584;
  undefined1 local_580 [4];
  int offset;
  string local_560;
  string local_540;
  string local_520;
  stringstream local_500 [8];
  stringstream amount_s;
  ostream local_4f0 [376];
  stringstream local_378 [8];
  stringstream offset_s;
  ostream local_368 [376];
  string local_1f0;
  string local_1c0;
  uint local_19c;
  stringstream local_198 [4];
  uint i;
  stringstream output;
  ostream local_188 [376];
  Lz77Decoder *local_10;
  Lz77Decoder *this_local;
  
  local_10 = this;
  poVar4 = std::operator<<((ostream *)&std::cout,"LZ77 decryption...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    uVar5 = (ulong)local_19c;
    Cryptor::get_in_message_abi_cxx11_(&local_1c0,&this->super_Cryptor);
    uVar6 = std::__cxx11::string::length();
    std::__cxx11::string::~string((string *)&local_1c0);
    if (uVar6 <= uVar5) break;
    Cryptor::get_in_message_abi_cxx11_(&local_1f0,&this->super_Cryptor);
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&local_1f0);
    cVar1 = *pcVar7;
    std::__cxx11::string::~string((string *)&local_1f0);
    if (cVar1 == '[') {
      local_19c = local_19c + 1;
      std::__cxx11::stringstream::stringstream(local_378);
      std::__cxx11::stringstream::stringstream(local_500);
      while( true ) {
        Cryptor::get_in_message_abi_cxx11_(&local_520,&this->super_Cryptor);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&local_520);
        cVar1 = *pcVar7;
        std::__cxx11::string::~string((string *)&local_520);
        if (cVar1 == ',') break;
        Cryptor::get_in_message_abi_cxx11_(&local_540,&this->super_Cryptor);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&local_540);
        poVar4 = std::operator<<(local_368,*pcVar7);
        std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_540);
        local_19c = local_19c + 1;
      }
      while( true ) {
        local_19c = local_19c + 1;
        Cryptor::get_in_message_abi_cxx11_(&local_560,&this->super_Cryptor);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&local_560);
        cVar1 = *pcVar7;
        std::__cxx11::string::~string((string *)&local_560);
        if (cVar1 == ']') break;
        Cryptor::get_in_message_abi_cxx11_((string *)local_580,&this->super_Cryptor);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_580);
        poVar4 = std::operator<<(local_4f0,*pcVar7);
        std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_580);
      }
      std::__cxx11::stringstream::str();
      iVar2 = std::__cxx11::stoi((string *)local_5a8,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_5a8);
      local_584 = iVar2;
      std::__cxx11::stringstream::str();
      iVar2 = std::__cxx11::stoi((string *)local_5d0,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_5d0);
      local_5ac = iVar2;
      std::__cxx11::stringstream::str();
      uVar3 = std::__cxx11::string::length();
      std::__cxx11::string::~string(local_5f8);
      local_5d4 = uVar3;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::substr((ulong)local_618,(ulong)local_638);
      poVar4 = std::operator<<(local_188,local_618);
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_618);
      std::__cxx11::string::~string(local_638);
      std::__cxx11::stringstream::~stringstream(local_500);
      std::__cxx11::stringstream::~stringstream(local_378);
    }
    else {
      Cryptor::get_in_message_abi_cxx11_(&local_658,&this->super_Cryptor);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&local_658);
      poVar4 = std::operator<<(local_188,*pcVar7);
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_658);
    }
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  Cryptor::set_out_message(&this->super_Cryptor,&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  poVar4 = std::operator<<((ostream *)&std::cout,"decryption done.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void Lz77Decoder::run() {
  cout << "LZ77 decryption..." << endl;

  stringstream output;

  for (unsigned int i = 0; i < get_in_message().length(); i++) {
    if (get_in_message()[i] == LEFT_BREAK) {
      i++;

      stringstream offset_s;
      stringstream amount_s;
      while (get_in_message()[i] != SEPARATOR) {
        offset_s << get_in_message()[i] << flush;
        i++;
      }
      i++;
      while (get_in_message()[i] != RIGHT_BREAK) {
        amount_s << get_in_message()[i] << flush;
        i++;
      }

      auto offset = stoi(offset_s.str());
      auto amount = stoi(amount_s.str());
      auto len = static_cast<int>(output.str().length());

      output << output.str().substr(static_cast<unsigned long>(len - offset),
        static_cast<unsigned long>(amount)) << flush;
    }
    else {
      output << get_in_message()[i] << flush;
    }
  }

  set_out_message(output.str());

  cout << "decryption done." << endl;
}